

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree.cpp
# Opt level: O0

ll __thiscall Segtree::pointQuery(Segtree *this,int i)

{
  long lVar1;
  ll lVar2;
  Segtree *local_38;
  int mid;
  int i_local;
  Segtree *this_local;
  
  if (this->r - this->l == 1) {
    this_local = (Segtree *)this->val;
  }
  else {
    lVar1 = this->val;
    if (i < (this->l + this->r) / 2) {
      local_38 = this->lson;
    }
    else {
      local_38 = this->rson;
    }
    lVar2 = pointQuery(local_38,i);
    this_local = (Segtree *)(lVar1 + lVar2);
  }
  return (ll)this_local;
}

Assistant:

ll pointQuery(int i) const {
        if (r - l == 1) return val;
        int mid = (l + r) / 2;
        return val + ((i < mid) ? lson : rson)->pointQuery(i);
    }